

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bels.c
# Opt level: O1

err_t belsRecover(octet *s,size_t count,size_t len,octet *si,octet *m0,octet *mi)

{
  word *stack;
  size_t sVar1;
  size_t m;
  u64 *dest;
  word *c;
  word *da;
  word *db;
  long lVar2;
  long lVar3;
  long lVar4;
  bool_t bVar5;
  int iVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  size_t sVar11;
  size_t sVar12;
  size_t sVar13;
  u64 *dest_00;
  word *d;
  ulong uVar14;
  u64 *dest_01;
  err_t eVar15;
  ulong uVar16;
  size_t sVar17;
  size_t n;
  ulong n_00;
  size_t n_01;
  long lVar18;
  octet *src;
  long lVar19;
  word *local_e0;
  octet *local_c0;
  long local_40;
  
  eVar15 = 0x6d;
  if ((count != 0) && (len == 0x20 || (len & 0xfffffffffffffff7) == 0x10)) {
    bVar5 = memIsValid(si,len * count);
    if (bVar5 != 0) {
      bVar5 = memIsValid(m0,len);
      if (bVar5 != 0) {
        bVar5 = memIsValid(mi,len * count);
        if (bVar5 != 0) {
          bVar5 = memIsValid(s,len);
          if (bVar5 != 0) {
            n_00 = len >> 3;
            sVar7 = ppMul_deep(n_00,n_00);
            n = n_00 * count;
            m = n_00 + 1;
            sVar8 = ppMod_deep(n,m);
            sVar7 = utilMax(2,sVar7,sVar8);
            if (1 < count) {
              lVar18 = count - 1;
              sVar1 = n_00 * 2;
              sVar8 = n_00 * 2 + 1;
              sVar17 = n_00 * 3;
              uVar16 = n_00;
              n_01 = sVar1;
              do {
                sVar9 = ppExGCD_deep(m,uVar16 + 1);
                sVar10 = ppMul_deep(uVar16,uVar16);
                sVar11 = ppMul_deep(n_01,n_00);
                sVar12 = ppMul_deep(len >> 2,uVar16);
                sVar13 = ppMod_deep(sVar17,sVar8);
                sVar7 = utilMax(6,sVar7,sVar9,sVar10,sVar11,sVar12,sVar13);
                sVar8 = sVar8 + n_00;
                uVar16 = uVar16 + n_00;
                sVar17 = sVar17 + sVar1;
                n_01 = n_01 + sVar1;
                lVar18 = lVar18 + -1;
              } while (lVar18 != 0);
            }
            local_40 = count - 1;
            lVar18 = n_00 * local_40;
            lVar19 = (count * 2 + -1) * n_00;
            uVar14 = (count * 2 + -2) * n_00;
            uVar16 = (count + 1) * n_00;
            if (uVar16 <= uVar14 && uVar14 - uVar16 != 0) {
              uVar16 = uVar14;
            }
            dest_00 = (u64 *)blobCreate(sVar7 + lVar18 * 0x10 + (n_00 + n + m + lVar19 + uVar16) * 8
                                        + 0x20);
            if (dest_00 == (u64 *)0x0) {
              eVar15 = 0x6e;
            }
            else {
              dest_01 = (u64 *)((long)dest_00 + len + 8);
              lVar2 = n * 8 + len + 8;
              lVar3 = lVar18 * 8 + lVar2 + 8;
              lVar4 = lVar18 * 8 + lVar3 + 8;
              dest = (u64 *)((long)dest_00 + len + 0x10 + lVar4);
              c = (word *)((long)dest_00 + lVar19 * 8 + len + lVar4 + 0x10);
              stack = c + uVar16;
              u64From(dest,si,len);
              u64From(dest_01,mi,len);
              *(undefined8 *)((long)dest_00 + len * 2 + 8) = 1;
              *(undefined8 *)((long)dest_00 + len) = 1;
              if (1 < count) {
                d = (word *)((long)dest_00 + n * 8 + len + 0x10);
                da = (word *)((long)dest_00 + lVar18 * 8 + lVar2 + 0x10);
                db = (word *)((long)dest_00 + lVar18 * 8 + lVar3 + 0x10);
                lVar18 = n_00 * 2;
                local_e0 = (word *)((long)dest_00 + (count * 0x28 + -0x10) * n_00 + len * 2 + 0x28);
                local_c0 = si + len;
                src = mi + len;
                sVar7 = 0;
                sVar8 = 0;
                do {
                  u64From(dest_00,src,len);
                  sVar17 = sVar8 + n_00 + 1;
                  ppExGCD(d,da,db,dest_00,m,dest_01,sVar17,stack);
                  iVar6 = wwCmpW(d,sVar17,1);
                  if (iVar6 != 0) {
                    eVar15 = 0x1f9;
                    goto LAB_001199ff;
                  }
                  sVar17 = n_00 + sVar8;
                  ppMul(c,da,sVar17,dest,sVar17,stack);
                  sVar1 = lVar18 + sVar7;
                  ppMul(dest,c,sVar1,dest_00,n_00,stack);
                  wwXor2((word *)((long)dest + len),c,sVar1);
                  u64From(c,local_c0,len);
                  ppMul(d,db,n_00,c,n_00,stack);
                  ppMul(c,d,len >> 2,dest_01,sVar17,stack);
                  wwXor2(local_e0,d,len >> 2);
                  wwXor2(dest,c,n_00 * 3 + sVar8);
                  ppMul(c,dest_00,n_00,dest_01,sVar17,stack);
                  wwXor2((word *)((long)c + len),dest_01,sVar17);
                  wwXor2(local_e0,dest_00,n_00);
                  wwCopy(dest_01,c,lVar18 + sVar8);
                  *(undefined8 *)((long)dest_00 + sVar8 * 8 + n_00 * 0x10 + len + 8) = 1;
                  ppMod(dest,dest,sVar7 + n_00 * 3,dest_01,lVar18 + sVar8 + 1,stack);
                  local_e0 = local_e0 + n_00;
                  local_c0 = local_c0 + len;
                  src = src + len;
                  local_40 = local_40 + -1;
                  sVar7 = sVar1;
                  sVar8 = sVar17;
                } while (local_40 != 0);
              }
              u64From(dest_00,m0,len);
              *(undefined8 *)((long)dest_00 + len) = 1;
              ppMod(dest,dest,n,dest_00,m,stack);
              u64To(s,len,dest);
              eVar15 = 0;
LAB_001199ff:
              blobClose(dest_00);
            }
          }
        }
      }
    }
  }
  return eVar15;
}

Assistant:

err_t belsRecover(octet s[], size_t count, size_t len, const octet si[], 
	const octet m0[], const octet mi[])
{
	size_t n, i, deep;
	void* state;
	word* f;
	word* g;
	word* d;
	word* u;
	word* v;
	word* c;
	word* t;
	void* stack;
	// проверить входные данные
	if ((len != 16 && len != 24 && len != 32) || count == 0 || 
		!memIsValid(si, count * len) || !memIsValid(m0, len) || 
		!memIsValid(mi, len * count) || !memIsValid(s, len))
		return ERR_BAD_INPUT;
	EXPECT(belsValM(m0, len) == ERR_OK);
	// расчет глубины стека
	n = W_OF_O(len);
	deep = utilMax(2, 
		ppMul_deep(n, n), 
		ppMod_deep(count * n, n + 1));
	for (i = 1; i < count; ++i)
		deep = utilMax(6, 
			deep, 
			ppExGCD_deep(n + 1, i * n + 1),
			ppMul_deep(i * n, i * n),
			ppMul_deep(2 * i * n, n),
			ppMul_deep(2 * n, i * n),
			ppMod_deep((2 * i + 1) * n, (i + 1) * n + 1));
	deep += O_OF_W(
		n + 1 +			
		count * n + 1 +
		(count - 1) * n + 1 +
		(count - 1) * n + 1 +
		n + 1 +
		(2 * count - 1) * n + 
		MAX2((2 * count - 2) * n, (count + 1) * n));
	// создать состояние
	state = blobCreate(deep);
	if (state == 0)
		return ERR_OUTOFMEMORY;
	// раскладка состояния
	f = (word*)state;
	g = f + n + 1;
	d = g + count * n + 1;
	u = d + (count - 1) * n + 1;
	v = u + (count - 1) * n + 1;
	c = v + n + 1;
	t = c + (2 * count - 1) * n;
	stack = t + MAX2((2 * count - 2) * n, (count + 1) * n);
	// [n]c(x) <- s1(x)
	wwFrom(c, si, len);
	// [n + 1]g(x) <- x^l + m1(x)
	wwFrom(g, mi, len), g[n] = 1;
	// цикл по пользователям
	for (f[n] = 1, i = 1; i < count; ++i)
	{
		// [n + 1]f(x) <- x^l + mi(x)
		wwFrom(f, mi + i * len, len);
		// найти d(x) = \gcd(f(x), g(x)) и коэфф. Безу [i * n]u(x), [n]v(x)
		ppExGCD(d, u, v, f, n + 1, g, i * n + 1, stack);
		ASSERT(u[i * n] == 0 && v[n] == 0);
		// d(x) != 1? 
		if (wwCmpW(d, i * n + 1, 1) != 0)
		{
			blobClose(state);
			return ERR_BAD_PUBKEY;
		}
		// [2 * i * n]c(x) <- u(x)f(x)c(x)
		// (с помощью [2 * i * n]t)
		ppMul(t, u, i * n, c, i * n, stack);
		ppMul(c, t, 2 * i * n, f, n, stack);
		wwXor2(c + n, t, 2 * i * n);
		// c(x) <- c(x) + v(x)g(x)si(x)
		// (с помощью [2 * n]d и [(i + 2) * n]t)
		wwFrom(t, si + i * len, len);
		ppMul(d, v, n, t, n, stack);
		ppMul(t, d, 2 * n, g, i * n, stack);
		wwXor2(t + i * n, d, 2 * n);
		wwXor2(c, t, (i + 2) * n);
		// [(i + 1) * n + 1]g(x) <- g(x)f(x)
		// (с помощью [(i + 1) * n]t)
		ppMul(t, f, n, g, i * n, stack);
		wwXor2(t + n, g, i * n);
		wwXor2(t + i * n, f, n);
		wwCopy(g, t, (i + 1) * n);
		g[(i + 1) * n] = 1;
		// [(i + 1) * n]c(x) <- c(x) mod g(x)
		ppMod(c, c, (2 * i + 1) * n, g, (i + 1) * n + 1, stack);
		ASSERT(c[(i + 1) * n] == 0);
	}
	// [n]s(x) <- c(x) mod (x^l + m0(x))
	wwFrom(f, m0, len), f[n] = 1;
	ppMod(c, c, count * n, f, n + 1, stack);
	ASSERT(c[n] == 0);
	wwTo(s, len, c);
	// завершение
	blobClose(state);
	return ERR_OK;
}